

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

size_t __thiscall
polyscope::render::ManagedBuffer<unsigned_int>::size(ManagedBuffer<unsigned_int> *this)

{
  CanonicalDataSource CVar1;
  size_t sVar2;
  
  CVar1 = currentCanonicalDataSource(this);
  if (CVar1 == RenderBuffer) {
    if (this->deviceBufferType == Attribute) {
      sVar2 = ((this->renderAttributeBuffer).
               super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->dataSize;
    }
    else {
      sVar2 = (ulong)(this->sizeZ + (uint)(this->sizeZ == 0)) *
              (ulong)(this->sizeY + (uint)(this->sizeY == 0)) *
              (ulong)(this->sizeX + (uint)(this->sizeX == 0));
    }
  }
  else if (CVar1 == NeedsCompute) {
    sVar2 = 0;
  }
  else if (CVar1 == HostData) {
    sVar2 = (long)(this->data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 2;
  }
  else {
    sVar2 = 0xffffffffffffffff;
  }
  return sVar2;
}

Assistant:

size_t ManagedBuffer<T>::size() {

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    return data.size();
    break;

  case CanonicalDataSource::NeedsCompute:
    return 0;
    break;

  case CanonicalDataSource::RenderBuffer:
    if (deviceBufferType == DeviceBufferType::Attribute) {
      return renderAttributeBuffer->getDataSize();
    } else {
      size_t s = 1;
      if (sizeX > 0) s *= sizeX;
      if (sizeY > 0) s *= sizeY;
      if (sizeZ > 0) s *= sizeZ;
      return s;
    }
    break;
  };

  return INVALID_IND;
}